

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureVkImpl.cpp
# Opt level: O2

void __thiscall
Diligent::TextureVkImpl::CreateStagingTexture
          (TextureVkImpl *this,TextureData *pInitData,TextureFormatAttribs *FmtAttribs)

{
  TextureDesc *pTVar1;
  VulkanLogicalDevice *this_00;
  VkDeviceMemory memory;
  TextureSubResData *pTVar2;
  CPU_ACCESS_FLAGS CVar3;
  VkResult errorCode;
  RenderDeviceVkImpl *pRVar4;
  VulkanMemoryPage *pVVar5;
  type memoryOffset;
  uint8_t *puVar6;
  Uint64 UVar7;
  uint uVar8;
  uint uVar9;
  Uint32 layer;
  Uint32 ArraySlice;
  Uint32 mip;
  uint uVar10;
  bool bVar11;
  char (*pacStackY_100) [118];
  string msg;
  Uint64 local_c8;
  VkBufferCreateInfo local_b8;
  TextureFormatAttribs *local_80;
  TextureDesc *local_78;
  TextureData *local_70;
  VkMemoryRequirements StagingBufferMemReqs;
  string StagingBufferName;
  
  if ((pInitData == (TextureData *)0x0) || (pInitData->pSubResources == (TextureSubResData *)0x0)) {
    bVar11 = false;
  }
  else {
    bVar11 = pInitData->NumSubresources != 0;
  }
  local_80 = FmtAttribs;
  pRVar4 = DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
           ::GetDevice((DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                        *)this);
  this_00 = (pRVar4->m_LogicalVkDevice).
            super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  local_b8.pNext = (void *)0x0;
  local_b8.size = 0;
  local_b8.usage = 0;
  local_b8.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  local_b8.queueFamilyIndexCount = 0;
  local_b8._44_4_ = 0;
  local_b8.pQueueFamilyIndices = (uint32_t *)0x0;
  local_b8.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  local_b8._4_4_ = 0;
  local_b8.flags = 0;
  local_b8._20_4_ = 0;
  pTVar1 = &(this->super_TextureBase<Diligent::EngineVkImplTraits>).
            super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
            .m_Desc;
  local_b8.size = GetStagingTextureDataSize(pTVar1,0x10);
  CVar3 = (this->super_TextureBase<Diligent::EngineVkImplTraits>).
          super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
          .m_Desc.CPUAccessFlags;
  if (1 < (byte)((CVar3 & (CPU_ACCESS_FLAG_LAST|CPU_ACCESS_READ)) - CPU_ACCESS_READ)) {
    FormatString<char[75]>
              (&msg,(char (*) [75])
                    "Exactly one of CPU_ACCESS_READ or CPU_ACCESS_WRITE flags must be specified");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"CreateStagingTexture",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
               ,0x256);
    std::__cxx11::string::~string((string *)&msg);
    CVar3 = (this->super_TextureBase<Diligent::EngineVkImplTraits>).
            super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
            .m_Desc.CPUAccessFlags;
  }
  if ((CVar3 & CPU_ACCESS_READ) == CPU_ACCESS_NONE) {
    if ((CVar3 & CPU_ACCESS_FLAG_LAST) == CPU_ACCESS_NONE) {
      FormatString<char[22]>(&msg,(char (*) [22])"Unexpected CPU access");
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"CreateStagingTexture",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
                 ,0x271);
      std::__cxx11::string::~string((string *)&msg);
      pacStackY_100 = (char (*) [118])0x2;
    }
    else {
      local_b8.usage = 1;
      (this->super_TextureBase<Diligent::EngineVkImplTraits>).m_State = RESOURCE_STATE_COPY_SOURCE;
      pacStackY_100 = (char (*) [118])0x6;
    }
  }
  else {
    if (bVar11) {
      FormatString<char[54]>
                (&msg,(char (*) [54])"Readback textures should not be initialized with data");
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"CreateStagingTexture",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
                 ,0x25b);
      std::__cxx11::string::~string((string *)&msg);
    }
    local_b8.usage = 2;
    (this->super_TextureBase<Diligent::EngineVkImplTraits>).m_State = RESOURCE_STATE_COPY_DEST;
    pRVar4 = DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
             ::GetDevice((DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                          *)this);
    local_b8.size =
         AlignUp<unsigned_long,unsigned_long>
                   (local_b8.size,
                    *(VkDeviceSize *)
                     ((long)&(((pRVar4->m_PhysicalDevice)._M_t.
                               super___uniq_ptr_impl<VulkanUtilities::VulkanPhysicalDevice,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
                               .
                               super__Head_base<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_false>
                              ._M_head_impl)->m_Properties).limits + 0x1f0));
    pacStackY_100 = (char (*) [118])0xa;
  }
  local_b8.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  local_b8.queueFamilyIndexCount = 0;
  local_b8.pQueueFamilyIndices = (uint32_t *)0x0;
  std::__cxx11::string::string
            ((string *)&StagingBufferName,"Staging buffer for \'",(allocator *)&msg);
  local_70 = pInitData;
  std::__cxx11::string::append((char *)&StagingBufferName);
  std::__cxx11::string::push_back((char)&StagingBufferName);
  VulkanUtilities::VulkanLogicalDevice::CreateBuffer
            ((BufferWrapper *)&msg,this_00,&local_b8,StagingBufferName._M_dataplus._M_p);
  VulkanUtilities::VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2>::
  operator=(&this->m_StagingBuffer,
            (VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2> *)&msg);
  VulkanUtilities::VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2>::
  ~VulkanObjectWrapper
            ((VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2> *)&msg);
  VulkanUtilities::VulkanLogicalDevice::GetBufferMemoryRequirements
            (&StagingBufferMemReqs,this_00,(this->m_StagingBuffer).m_VkObject);
  if ((StagingBufferMemReqs.alignment ^ StagingBufferMemReqs.alignment - 1) <=
      StagingBufferMemReqs.alignment - 1) {
    FormatString<char[29]>(&msg,(char (*) [29])"Alignment is not power of 2!");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"CreateStagingTexture",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
               ,0x27d);
    std::__cxx11::string::~string((string *)&msg);
  }
  pRVar4 = DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
           ::GetDevice((DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                        *)this);
  VulkanUtilities::VulkanMemoryManager::Allocate
            ((VulkanMemoryAllocation *)&msg,&pRVar4->m_MemoryMgr,&StagingBufferMemReqs,
             (VkMemoryPropertyFlags)pacStackY_100,0);
  (this->m_MemoryAllocation).Page = (VulkanMemoryPage *)msg._M_dataplus._M_p;
  (this->m_MemoryAllocation).UnalignedOffset = msg._M_string_length;
  (this->m_MemoryAllocation).Size = msg.field_2._M_allocated_capacity;
  msg._M_dataplus._M_p = (pointer)0x0;
  msg._M_string_length = 0;
  msg.field_2._M_allocated_capacity = 0;
  VulkanUtilities::VulkanMemoryAllocation::~VulkanMemoryAllocation((VulkanMemoryAllocation *)&msg);
  pVVar5 = (this->m_MemoryAllocation).Page;
  if (pVVar5 == (VulkanMemoryPage *)0x0) {
    pacStackY_100 = (char (*) [118])0x281;
    LogError<true,char[48],char_const*,char[3]>
              (false,"CreateStagingTexture",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
               ,0x281,(char (*) [48])"Failed to allocate memory for staging texture \'",
               (char **)pTVar1,(char (*) [3])"\'.");
    pVVar5 = (this->m_MemoryAllocation).Page;
  }
  memory = (pVVar5->m_VkMemory).m_VkObject;
  local_78 = pTVar1;
  memoryOffset = AlignUp<unsigned_long,unsigned_long>
                           ((this->m_MemoryAllocation).UnalignedOffset,
                            StagingBufferMemReqs.alignment);
  if ((this->m_MemoryAllocation).Size <
      (StagingBufferMemReqs.size + memoryOffset) - (this->m_MemoryAllocation).UnalignedOffset) {
    FormatString<char[26],char[118]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "m_MemoryAllocation.Size >= StagingBufferMemReqs.size + (AlignedStagingMemOffset - m_MemoryAllocation.UnalignedOffset)"
               ,pacStackY_100);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"CreateStagingTexture",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
               ,0x285);
    std::__cxx11::string::~string((string *)&msg);
  }
  errorCode = VulkanUtilities::VulkanLogicalDevice::BindBufferMemory
                        (this_00,(this->m_StagingBuffer).m_VkObject,memory,memoryOffset);
  if (errorCode != VK_SUCCESS) {
    msg._M_dataplus._M_p = VulkanUtilities::VkResultToString(errorCode);
    LogError<true,char[37],char[17],char_const*>
              (false,"CreateStagingTexture",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TextureVkImpl.cpp"
               ,0x288,(char (*) [37])"Failed to bind staging buffer memory",
               (char (*) [17])"\nVK Error Code: ",(char **)&msg);
  }
  this->m_StagingDataAlignedOffset = memoryOffset;
  if (bVar11) {
    puVar6 = GetStagingDataCPUAddress(this);
    pTVar1 = local_78;
    ArraySlice = 0;
    uVar9 = 0;
    while( true ) {
      uVar10 = 1;
      uVar8 = (uint)(this->super_TextureBase<Diligent::EngineVkImplTraits>).
                    super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                    .m_Desc.Type;
      if ((uVar8 < 9) && (uVar10 = 1, (0x1a8U >> (uVar8 & 0x1f) & 1) != 0)) {
        uVar10 = (this->super_TextureBase<Diligent::EngineVkImplTraits>).
                 super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                 .m_Desc.field_3.ArraySize;
      }
      if (uVar10 <= ArraySlice) break;
      for (uVar10 = 0;
          uVar10 < (this->super_TextureBase<Diligent::EngineVkImplTraits>).
                   super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                   .m_Desc.MipLevels; uVar10 = uVar10 + 1) {
        pTVar2 = local_70->pSubResources;
        GetMipLevelProperties((MipLevelProperties *)&msg,pTVar1,uVar10);
        UVar7 = GetStagingTextureSubresourceOffset(pTVar1,ArraySlice,uVar10,0x10);
        CopyTextureSubresource
                  (pTVar2 + (uVar10 + uVar9),msg._M_string_length._4_4_ / local_80->BlockHeight,
                   msg.field_2._M_allocated_capacity._0_4_,msg.field_2._8_8_,puVar6 + UVar7,
                   msg.field_2._8_8_,local_c8);
      }
      ArraySlice = ArraySlice + 1;
      uVar9 = uVar10 + uVar9;
    }
  }
  std::__cxx11::string::~string((string *)&StagingBufferName);
  return;
}

Assistant:

void TextureVkImpl::CreateStagingTexture(const TextureData* pInitData, const TextureFormatAttribs& FmtAttribs)
{
    const bool                                  bInitializeTexture = (pInitData != nullptr && pInitData->pSubResources != nullptr && pInitData->NumSubresources > 0);
    const VulkanUtilities::VulkanLogicalDevice& LogicalDevice      = GetDevice()->GetLogicalDevice();

    VkBufferCreateInfo VkStagingBuffCI = {};

    VkStagingBuffCI.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
    VkStagingBuffCI.pNext = nullptr;
    VkStagingBuffCI.flags = 0;
    VkStagingBuffCI.size  = GetStagingTextureDataSize(m_Desc, StagingBufferOffsetAlignment);

    // clang-format off
        DEV_CHECK_ERR((m_Desc.CPUAccessFlags & (CPU_ACCESS_READ | CPU_ACCESS_WRITE)) == CPU_ACCESS_READ ||
                      (m_Desc.CPUAccessFlags & (CPU_ACCESS_READ | CPU_ACCESS_WRITE)) == CPU_ACCESS_WRITE,
                      "Exactly one of CPU_ACCESS_READ or CPU_ACCESS_WRITE flags must be specified");
    // clang-format on
    VkMemoryPropertyFlags MemProperties = VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT;
    if (m_Desc.CPUAccessFlags & CPU_ACCESS_READ)
    {
        DEV_CHECK_ERR(!bInitializeTexture, "Readback textures should not be initialized with data");

        VkStagingBuffCI.usage = VK_BUFFER_USAGE_TRANSFER_DST_BIT;
        MemProperties |= VK_MEMORY_PROPERTY_HOST_CACHED_BIT;
        SetState(RESOURCE_STATE_COPY_DEST);

        // We do not set HOST_COHERENT bit, so we will have to use InvalidateMappedMemoryRanges,
        // which requires the ranges to be aligned by nonCoherentAtomSize.
        const VkPhysicalDeviceLimits& DeviceLimits = GetDevice()->GetPhysicalDevice().GetProperties().limits;
        // Align the buffer size to ensure that any aligned range is always in bounds.
        VkStagingBuffCI.size = AlignUp(VkStagingBuffCI.size, DeviceLimits.nonCoherentAtomSize);
    }
    else if (m_Desc.CPUAccessFlags & CPU_ACCESS_WRITE)
    {
        VkStagingBuffCI.usage = VK_BUFFER_USAGE_TRANSFER_SRC_BIT;
        // VK_MEMORY_PROPERTY_HOST_COHERENT_BIT bit specifies that the host cache management commands vkFlushMappedMemoryRanges
        // and vkInvalidateMappedMemoryRanges are NOT needed to flush host writes to the device or make device writes visible
        // to the host (10.2)
        MemProperties |= VK_MEMORY_PROPERTY_HOST_COHERENT_BIT;
        SetState(RESOURCE_STATE_COPY_SOURCE);
    }
    else
        UNEXPECTED("Unexpected CPU access");

    VkStagingBuffCI.sharingMode           = VK_SHARING_MODE_EXCLUSIVE;
    VkStagingBuffCI.queueFamilyIndexCount = 0;
    VkStagingBuffCI.pQueueFamilyIndices   = nullptr;

    std::string StagingBufferName = "Staging buffer for '";
    StagingBufferName += m_Desc.Name;
    StagingBufferName += '\'';
    m_StagingBuffer = LogicalDevice.CreateBuffer(VkStagingBuffCI, StagingBufferName.c_str());

    VkMemoryRequirements StagingBufferMemReqs = LogicalDevice.GetBufferMemoryRequirements(m_StagingBuffer);
    VERIFY(IsPowerOfTwo(StagingBufferMemReqs.alignment), "Alignment is not power of 2!");

    m_MemoryAllocation = GetDevice()->AllocateMemory(StagingBufferMemReqs, MemProperties);
    if (!m_MemoryAllocation)
        LOG_ERROR_AND_THROW("Failed to allocate memory for staging texture '", m_Desc.Name, "'.");

    VkDeviceMemory StagingBufferMemory     = m_MemoryAllocation.Page->GetVkMemory();
    VkDeviceSize   AlignedStagingMemOffset = AlignUp(m_MemoryAllocation.UnalignedOffset, StagingBufferMemReqs.alignment);
    VERIFY_EXPR(m_MemoryAllocation.Size >= StagingBufferMemReqs.size + (AlignedStagingMemOffset - m_MemoryAllocation.UnalignedOffset));

    VkResult err = LogicalDevice.BindBufferMemory(m_StagingBuffer, StagingBufferMemory, AlignedStagingMemOffset);
    CHECK_VK_ERROR_AND_THROW(err, "Failed to bind staging buffer memory");

    m_StagingDataAlignedOffset = AlignedStagingMemOffset;

    if (bInitializeTexture)
    {
        uint8_t* const pStagingData = GetStagingDataCPUAddress();

        Uint32 subres = 0;
        for (Uint32 layer = 0; layer < m_Desc.GetArraySize(); ++layer)
        {
            for (Uint32 mip = 0; mip < m_Desc.MipLevels; ++mip)
            {
                const TextureSubResData& SubResData = pInitData->pSubResources[subres++];
                const MipLevelProperties MipProps   = GetMipLevelProperties(m_Desc, mip);

                const Uint64 DstSubresOffset =
                    GetStagingTextureSubresourceOffset(m_Desc, layer, mip, StagingBufferOffsetAlignment);

                CopyTextureSubresource(SubResData,
                                       MipProps.StorageHeight / FmtAttribs.BlockHeight, // NumRows
                                       MipProps.Depth,
                                       MipProps.RowSize,
                                       pStagingData + DstSubresOffset,
                                       MipProps.RowSize,       // DstRowStride
                                       MipProps.DepthSliceSize // DstDepthStride
                );
            }
        }
    }
}